

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O1

string * cppcms::filters::streamable::to_string<char>
                   (string *__return_storage_ptr__,ios *out,void *ptr)

{
  ostringstream oss;
  char local_199;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ios::copyfmt((ios *)((ostringstream *)local_198 + *(long *)(local_198[0] + -0x18)));
  local_199 = *ptr;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_199,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(std::ios &out,void const *ptr)
			{
				T const *object=reinterpret_cast<T const *>(ptr);
				std::ostringstream oss;
				oss.copyfmt(out);
				oss << *object;
				return oss.str();
			}